

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classset.h
# Opt level: O0

void __thiscall
soplex::ClassSet<soplex::SVSetBase<double>::DLPSV>::~ClassSet
          (ClassSet<soplex::SVSetBase<double>::DLPSV> *this)

{
  long *in_RDI;
  
  if (*in_RDI != 0) {
    spx_free<soplex::ClassSet<soplex::SVSetBase<double>::DLPSV>::Item*>((Item **)0x262183);
  }
  if (in_RDI[1] != 0) {
    spx_free<soplex::DataKey*>((DataKey **)0x26219d);
  }
  return;
}

Assistant:

~ClassSet()
   {
      if(theitem)
         spx_free(theitem);

      if(thekey)
         spx_free(thekey);
   }